

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O2

void __thiscall sentencepiece::TrainerSpec::Clear(TrainerSpec *this)

{
  uint uVar1;
  undefined8 *puVar2;
  Arena *pAVar3;
  
  google::protobuf::internal::ExtensionSet::Clear(&this->_extensions_);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->input_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->accept_language_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->control_symbols_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->user_defined_symbols_).super_RepeatedPtrFieldBase);
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((char)uVar1 != '\0') {
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)((ulong)(this->model_prefix_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
      puVar2[1] = 0;
      *(undefined1 *)*puVar2 = 0;
    }
    if ((uVar1 & 2) != 0) {
      puVar2 = (undefined8 *)((ulong)(this->input_format_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
      puVar2[1] = 0;
      *(undefined1 *)*puVar2 = 0;
    }
    if ((uVar1 & 4) != 0) {
      puVar2 = (undefined8 *)((ulong)(this->required_chars_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
      puVar2[1] = 0;
      *(undefined1 *)*puVar2 = 0;
    }
    if ((uVar1 & 8) != 0) {
      pAVar3 = (Arena *)(this->super_MessageLite)._internal_metadata_.ptr_;
      if (((ulong)pAVar3 & 1) != 0) {
        pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::ClearToDefault
                (&this->unk_surface_,
                 (LazyString *)_i_give_permission_to_break_this_code_default_unk_surface_,pAVar3);
    }
    if ((uVar1 & 0x10) != 0) {
      pAVar3 = (Arena *)(this->super_MessageLite)._internal_metadata_.ptr_;
      if (((ulong)pAVar3 & 1) != 0) {
        pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::ClearToDefault
                (&this->unk_piece_,
                 (LazyString *)_i_give_permission_to_break_this_code_default_unk_piece_,pAVar3);
    }
    if ((uVar1 & 0x20) != 0) {
      pAVar3 = (Arena *)(this->super_MessageLite)._internal_metadata_.ptr_;
      if (((ulong)pAVar3 & 1) != 0) {
        pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::ClearToDefault
                (&this->bos_piece_,
                 (LazyString *)_i_give_permission_to_break_this_code_default_bos_piece_,pAVar3);
    }
    if ((uVar1 & 0x40) != 0) {
      pAVar3 = (Arena *)(this->super_MessageLite)._internal_metadata_.ptr_;
      if (((ulong)pAVar3 & 1) != 0) {
        pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::ClearToDefault
                (&this->eos_piece_,
                 (LazyString *)_i_give_permission_to_break_this_code_default_eos_piece_,pAVar3);
    }
    if ((char)uVar1 < '\0') {
      pAVar3 = (Arena *)(this->super_MessageLite)._internal_metadata_.ptr_;
      if (((ulong)pAVar3 & 1) != 0) {
        pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::ClearToDefault
                (&this->pad_piece_,
                 (LazyString *)_i_give_permission_to_break_this_code_default_pad_piece_,pAVar3);
    }
  }
  if ((uVar1 & 0x300) != 0) {
    if ((uVar1 >> 8 & 1) != 0) {
      puVar2 = (undefined8 *)
               ((ulong)(this->pretokenization_delimiter_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
      puVar2[1] = 0;
      *(undefined1 *)*puVar2 = 0;
    }
    if ((uVar1 >> 9 & 1) != 0) {
      puVar2 = (undefined8 *)
               ((ulong)(this->seed_sentencepieces_file_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
      puVar2[1] = 0;
      *(undefined1 *)*puVar2 = 0;
    }
  }
  if ((uVar1 & 0xfc00) != 0) {
    this->self_test_sample_size_ = 0;
    this->mining_sentence_size_ = 0;
    this->input_sentence_size_ = 0;
    *(undefined8 *)((long)&this->input_sentence_size_ + 6) = 0;
  }
  if ((uVar1 & 0xff0000) != 0) {
    *(undefined8 *)&this->differential_privacy_noise_level_ = 0;
    this->differential_privacy_clipping_threshold_ = 0;
    *(undefined8 *)&this->allow_whitespace_only_pieces_ = 0;
    *(undefined8 *)((long)&this->unk_id_ + 2) = 0;
  }
  if (0xffffff < uVar1) {
    this->model_type_ = 1;
    this->vocab_size_ = 8000;
    this->character_coverage_ = 0.9995;
    this->seed_sentencepiece_size_ = 1000000;
    this->shrinking_factor_ = 0.75;
    this->num_threads_ = 0x10;
    this->num_sub_iterations_ = 2;
    this->max_sentence_length_ = 0x1060;
  }
  uVar1 = (this->_has_bits_).has_bits_[1];
  if ((char)uVar1 != '\0') {
    this->max_sentencepiece_length_ = 0x10;
    this->shuffle_input_sentence_ = true;
    this->split_by_unicode_script_ = true;
    this->split_by_number_ = true;
    this->split_by_whitespace_ = true;
    this->vocabulary_output_piece_score_ = true;
    this->hard_vocab_limit_ = true;
    this->bos_id_ = 1;
  }
  if ((uVar1 & 0x300) != 0) {
    this->eos_id_ = 2;
    this->pad_id_ = -1;
  }
  *(undefined8 *)(this->_has_bits_).has_bits_ = 0;
  if (((ulong)(this->super_MessageLite)._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void TrainerSpec::Clear() {
// @@protoc_insertion_point(message_clear_start:sentencepiece.TrainerSpec)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _extensions_.Clear();
  input_.Clear();
  accept_language_.Clear();
  control_symbols_.Clear();
  user_defined_symbols_.Clear();
  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x000000ffu) {
    if (cached_has_bits & 0x00000001u) {
      model_prefix_.ClearNonDefaultToEmpty();
    }
    if (cached_has_bits & 0x00000002u) {
      input_format_.ClearNonDefaultToEmpty();
    }
    if (cached_has_bits & 0x00000004u) {
      required_chars_.ClearNonDefaultToEmpty();
    }
    if (cached_has_bits & 0x00000008u) {
      unk_surface_.ClearToDefault(::sentencepiece::TrainerSpec::_i_give_permission_to_break_this_code_default_unk_surface_, GetArena());
       }
    if (cached_has_bits & 0x00000010u) {
      unk_piece_.ClearToDefault(::sentencepiece::TrainerSpec::_i_give_permission_to_break_this_code_default_unk_piece_, GetArena());
       }
    if (cached_has_bits & 0x00000020u) {
      bos_piece_.ClearToDefault(::sentencepiece::TrainerSpec::_i_give_permission_to_break_this_code_default_bos_piece_, GetArena());
       }
    if (cached_has_bits & 0x00000040u) {
      eos_piece_.ClearToDefault(::sentencepiece::TrainerSpec::_i_give_permission_to_break_this_code_default_eos_piece_, GetArena());
       }
    if (cached_has_bits & 0x00000080u) {
      pad_piece_.ClearToDefault(::sentencepiece::TrainerSpec::_i_give_permission_to_break_this_code_default_pad_piece_, GetArena());
       }
  }
  if (cached_has_bits & 0x00000300u) {
    if (cached_has_bits & 0x00000100u) {
      pretokenization_delimiter_.ClearNonDefaultToEmpty();
    }
    if (cached_has_bits & 0x00000200u) {
      seed_sentencepieces_file_.ClearNonDefaultToEmpty();
    }
  }
  if (cached_has_bits & 0x0000fc00u) {
    ::memset(&self_test_sample_size_, 0, static_cast<size_t>(
        reinterpret_cast<char*>(&treat_whitespace_as_suffix_) -
        reinterpret_cast<char*>(&self_test_sample_size_)) + sizeof(treat_whitespace_as_suffix_));
  }
  if (cached_has_bits & 0x00ff0000u) {
    ::memset(&allow_whitespace_only_pieces_, 0, static_cast<size_t>(
        reinterpret_cast<char*>(&differential_privacy_clipping_threshold_) -
        reinterpret_cast<char*>(&allow_whitespace_only_pieces_)) + sizeof(differential_privacy_clipping_threshold_));
  }
  if (cached_has_bits & 0xff000000u) {
    model_type_ = 1;
    vocab_size_ = 8000;
    character_coverage_ = 0.9995f;
    seed_sentencepiece_size_ = 1000000;
    shrinking_factor_ = 0.75f;
    num_threads_ = 16;
    num_sub_iterations_ = 2;
    max_sentence_length_ = 4192;
  }
  cached_has_bits = _has_bits_[1];
  if (cached_has_bits & 0x000000ffu) {
    max_sentencepiece_length_ = 16;
    shuffle_input_sentence_ = true;
    split_by_unicode_script_ = true;
    split_by_number_ = true;
    split_by_whitespace_ = true;
    vocabulary_output_piece_score_ = true;
    hard_vocab_limit_ = true;
    bos_id_ = 1;
  }
  if (cached_has_bits & 0x00000300u) {
    eos_id_ = 2;
    pad_id_ = -1;
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear<std::string>();
}